

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O1

String8 * helper::to_utf8(String8 *__return_storage_ptr__,StringW *str)

{
  wchar_t *__first;
  range_error error;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  local_78;
  
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert(&local_78);
  __first = (str->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,&local_78,__first,__first + str->_M_string_length);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_78);
  return __return_storage_ptr__;
}

Assistant:

String8 to_utf8( const StringW &str )
	{
		std::wstring_convert<std::codecvt_utf8<wchar_t>> converter;
		try
		{
			return converter.to_bytes( str );
		}
		catch( std::range_error error )
		{
			log( "Conversation failure 'to_utf8(const StringW &)'. Message: " + String8( error.what() ), LogLevel::Warning );
			return "";
		}
	}